

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithSizeTLineWorks_Test::
TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithSizeTLineWorks_Test
          (TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithSizeTLineWorks_Test
           *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode).super_Utest.
  _vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode).memLeakDetector
       = (MemoryLeakDetector *)0x0;
  TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode::
  TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode
            (&this->super_TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode).super_Utest.
  _vptr_Utest = (_func_int **)&PTR__Utest_0037d3b8;
  return;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, newDeleteOverloadsWithSizeTLineWorks)
{
    const size_t line = 42;
    char* leak = new("TestFile.cpp", line) char;

    size_t memLeaks = memLeakDetector->totalMemoryLeaks(mem_leak_period_checking);
    STRCMP_NOCASE_CONTAINS("Allocated at: TestFile.cpp and line: 42.", memLeakDetector->report(mem_leak_period_checking));

    ::operator delete (leak, "TestFile.cpp", line);

    LONGS_EQUAL(memLeaks-1, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
}